

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 *
cfd::core::CryptoUtil::MerkleHashSha256Midstate
          (ByteData256 *__return_storage_ptr__,ByteData256 *left,ByteData256 *right)

{
  CfdException *this;
  allocator local_8d;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> right_buffer;
  undefined1 local_40 [32];
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&output,0x20,(allocator_type *)local_40);
  ByteData256::GetBytes(&buffer,left);
  ByteData256::GetBytes(&right_buffer,right);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&buffer,
             (const_iterator)
             buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )right_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )right_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  ret = wally_sha256_midstate
                  (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData256::ByteData256(__return_storage_ptr__,&output);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&right_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_40._0_8_ = "cfdcore_util.cpp";
  local_40._8_4_ = 0x45b;
  local_40._16_8_ = "MerkleHashSha256Midstate";
  logger::warn<int&>((CfdSourceLocation *)local_40,"wally_sha256_midstate NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"MerkleHash calc error.",&local_8d);
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 CryptoUtil::MerkleHashSha256Midstate(
    const ByteData256 &left, const ByteData256 &right) {
  // CSHA256().Write(left.begin(), 32).Write(right.begin(), 32)
  // .Midstate(output.begin(), NULL, NULL);
  std::vector<uint8_t> output(32);
  std::vector<uint8_t> buffer = left.GetBytes();
  std::vector<uint8_t> right_buffer = right.GetBytes();
  buffer.insert(buffer.end(), right_buffer.begin(), right_buffer.end());
  int ret = wally_sha256_midstate(
      buffer.data(), buffer.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_sha256_midstate NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "MerkleHash calc error.");
  }
  return ByteData256(output);
}